

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * substExpr(SubstContext *pSubst,Expr *pExpr)

{
  sqlite3 *psVar1;
  int iVar2;
  Expr *pEVar3;
  Expr *in_RSI;
  undefined8 *in_RDI;
  sqlite3 *db;
  Expr ifNullRow;
  Expr *pCopy;
  Expr *pNew;
  Expr *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  Expr *in_stack_ffffffffffffff98;
  sqlite3 *in_stack_ffffffffffffffa0;
  Select *in_stack_ffffffffffffffa8;
  SubstContext *in_stack_ffffffffffffffb0;
  Expr *in_stack_ffffffffffffffe0;
  Expr *local_8;
  
  if (in_RSI == (Expr *)0x0) {
    local_8 = (Expr *)0x0;
  }
  else {
    if (((in_RSI->flags & 1) != 0) && ((int)in_RSI->iRightJoinTable == *(int *)(in_RDI + 1))) {
      in_RSI->iRightJoinTable = (i16)*(undefined4 *)((long)in_RDI + 0xc);
    }
    if ((in_RSI->op == 0x9e) && (in_RSI->iTable == *(int *)(in_RDI + 1))) {
      if (in_RSI->iColumn < 0) {
        in_RSI->op = 'n';
        local_8 = in_RSI;
      }
      else {
        psVar1 = *(sqlite3 **)(in_RDI[3] + 8 + (long)in_RSI->iColumn * 0x20);
        iVar2 = sqlite3ExprIsVector((Expr *)0x1b834f);
        if (iVar2 == 0) {
          pEVar3 = *(Expr **)*in_RDI;
          if ((*(int *)(in_RDI + 2) != 0) && (*(char *)&psVar1->pVfs != -0x62)) {
            memset(&stack0xffffffffffffff90,0,0x48);
            in_stack_ffffffffffffff90 = CONCAT31((int3)((uint)in_stack_ffffffffffffff90 >> 8),0xa7);
            in_stack_ffffffffffffffa0 = psVar1;
          }
          local_8 = sqlite3ExprDup(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                   in_stack_ffffffffffffff94);
          if ((local_8 != (Expr *)0x0) && (*(int *)(in_RDI + 2) != 0)) {
            local_8->flags = local_8->flags | 0x100000;
          }
          if ((local_8 != (Expr *)0x0) && ((in_RSI->flags & 1) != 0)) {
            local_8->iRightJoinTable = in_RSI->iRightJoinTable;
            local_8->flags = local_8->flags | 1;
          }
          sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                            ,pEVar3);
        }
        else {
          sqlite3VectorErrorMsg
                    ((Parse *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88);
          local_8 = in_RSI;
        }
      }
    }
    else {
      if ((in_RSI->op == 0xa7) && (in_RSI->iTable == *(int *)(in_RDI + 1))) {
        in_RSI->iTable = *(int *)((long)in_RDI + 0xc);
      }
      pEVar3 = substExpr((SubstContext *)in_RSI,in_stack_ffffffffffffffe0);
      iVar2 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
      in_RSI->pLeft = pEVar3;
      pEVar3 = substExpr((SubstContext *)in_RSI,in_stack_ffffffffffffffe0);
      in_RSI->pRight = pEVar3;
      if ((in_RSI->flags & 0x800) == 0) {
        substExprList((SubstContext *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      (ExprList *)in_stack_ffffffffffffff88);
        local_8 = in_RSI;
      }
      else {
        substSelect(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,iVar2);
        local_8 = in_RSI;
      }
    }
  }
  return local_8;
}

Assistant:

static Expr *substExpr(
  SubstContext *pSubst,  /* Description of the substitution */
  Expr *pExpr            /* Expr in which substitution occurs */
){
  if( pExpr==0 ) return 0;
  if( ExprHasProperty(pExpr, EP_FromJoin)
   && pExpr->iRightJoinTable==pSubst->iTable
  ){
    pExpr->iRightJoinTable = pSubst->iNewTable;
  }
  if( pExpr->op==TK_COLUMN && pExpr->iTable==pSubst->iTable ){
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else{
      Expr *pNew;
      Expr *pCopy = pSubst->pEList->a[pExpr->iColumn].pExpr;
      Expr ifNullRow;
      assert( pSubst->pEList!=0 && pExpr->iColumn<pSubst->pEList->nExpr );
      assert( pExpr->pRight==0 );
      if( sqlite3ExprIsVector(pCopy) ){
        sqlite3VectorErrorMsg(pSubst->pParse, pCopy);
      }else{
        sqlite3 *db = pSubst->pParse->db;
        if( pSubst->isLeftJoin && pCopy->op!=TK_COLUMN ){
          memset(&ifNullRow, 0, sizeof(ifNullRow));
          ifNullRow.op = TK_IF_NULL_ROW;
          ifNullRow.pLeft = pCopy;
          ifNullRow.iTable = pSubst->iNewTable;
          pCopy = &ifNullRow;
        }
        pNew = sqlite3ExprDup(db, pCopy, 0);
        if( pNew && pSubst->isLeftJoin ){
          ExprSetProperty(pNew, EP_CanBeNull);
        }
        if( pNew && ExprHasProperty(pExpr,EP_FromJoin) ){
          pNew->iRightJoinTable = pExpr->iRightJoinTable;
          ExprSetProperty(pNew, EP_FromJoin);
        }
        sqlite3ExprDelete(db, pExpr);
        pExpr = pNew;
      }
    }
  }else{
    if( pExpr->op==TK_IF_NULL_ROW && pExpr->iTable==pSubst->iTable ){
      pExpr->iTable = pSubst->iNewTable;
    }
    pExpr->pLeft = substExpr(pSubst, pExpr->pLeft);
    pExpr->pRight = substExpr(pSubst, pExpr->pRight);
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      substSelect(pSubst, pExpr->x.pSelect, 1);
    }else{
      substExprList(pSubst, pExpr->x.pList);
    }
  }
  return pExpr;
}